

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall
QGenericItemModel::itemData(QGenericItemModel *this,QModelIndex *index)

{
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  in_RDI;
  ConstOp in_stack_00000024;
  QGenericItemModelImplBase *in_stack_00000028;
  
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84fa01);
  QGenericItemModelImplBase::callConst<QMap<int,QVariant>,QModelIndex>
            (in_stack_00000028,in_stack_00000024,(QModelIndex *)this);
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

QMap<int, QVariant> QGenericItemModel::itemData(const QModelIndex &index) const
{
    return impl->callConst<QMap<int, QVariant>>(QGenericItemModelImplBase::ItemData, index);
}